

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

void __thiscall
opts::OptionContainer<bool>::OptionContainer
          (OptionContainer<bool> *this,char s_,string *l_,bool *var_,string *help_)

{
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)l_);
  std::__cxx11::string::string((string *)&local_60,"",&local_a1);
  std::__cxx11::string::string((string *)&local_80,"",&local_a2);
  std::__cxx11::string::string((string *)&local_a0,(string *)help_);
  BasicOption::BasicOption(&this->super_BasicOption,s_,&local_40,&local_60,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_BasicOption)._vptr_BasicOption = (_func_int **)&PTR__BasicOption_001429c0;
  this->var = var_;
  *var_ = false;
  return;
}

Assistant:

OptionContainer(char               s_,
                                    const std::string& l_,
                                    bool&              var_,
                                    const std::string& help_):
                        BasicOption(s_, l_, "", "", help_),
                        var(&var_)                          { *var = false; }